

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void clearvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  GCObject *pGVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  TValue *o;
  Table *h;
  
  if (l != f) {
    do {
      bVar1 = l->field_0xb;
      lVar2 = *(long *)&l[1].tt;
      if (*(int *)&l->field_0xc != 0) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          pGVar3 = l[1].next;
          iVar4 = iscleared(g,(TValue *)((long)&pGVar3->next + lVar6));
          if (iVar4 != 0) {
            *(undefined4 *)(&pGVar3->tt + lVar6) = 0;
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (uVar5 < *(uint *)&l->field_0xc);
      }
      for (o = *(TValue **)&l[1].tt; o < (TValue *)((long)(1 << (bVar1 & 0x1f)) * 0x20 + lVar2);
          o = o + 2) {
        if ((((o->tt_ != 0) && (iVar4 = iscleared(g,o), iVar4 != 0)) &&
            (o->tt_ = 0, (o[1].tt_ & 0x40) != 0)) && (((o[1].value_.gc)->marked & 3) != 0)) {
          o[1].tt_ = 10;
        }
      }
      l = l[3].next;
    } while (l != f);
  }
  return;
}

Assistant:

static void clearvalues(global_State *g, GCObject *l, GCObject *f) {
    for (; l != f; l = gco2t(l)->gclist) {
        Table *h = gco2t(l);
        Node *n, *limit = gnodelast(h);
        unsigned int i;
        for (i = 0; i < h->sizearray; i++) {
            TValue *o = &h->array[i];
            if (iscleared(g, o))  /* value was collected? */
                setnilvalue(o);  /* remove value */
        }
        for (n = gnode(h, 0); n < limit; n++) {
            if (!ttisnil(gval(n)) && iscleared(g, gval(n))) {
                setnilvalue(gval(n));  /* remove value ... */
                removeentry(n);  /* and remove entry from table */
            }
        }
    }
}